

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::SkipField
               (CodedInputStream *input,uint32_t tag,CodedOutputStream *output)

{
  int iVar1;
  bool bVar2;
  uint32_t length;
  uint64_t value;
  uint32_t local_44;
  string local_40;
  
  if (tag < 8) goto LAB_002d17f5;
  bVar2 = false;
  switch(tag & 7) {
  case 0:
    bVar2 = io::CodedInputStream::ReadVarint64(input,(uint64_t *)&local_40);
    if (bVar2) {
      io::CodedOutputStream::WriteVarint32(output,tag);
      io::CodedOutputStream::WriteVarint64(output,(uint64_t)local_40._M_dataplus._M_p);
    }
    break;
  case 1:
    bVar2 = io::CodedInputStream::ReadLittleEndian64(input,(uint64_t *)&local_40);
    if (bVar2) {
      io::CodedOutputStream::WriteVarint32(output,tag);
      io::CodedOutputStream::WriteLittleEndian64(output,(uint64_t)local_40._M_dataplus._M_p);
    }
    break;
  case 2:
    bVar2 = io::CodedInputStream::ReadVarint32(input,&local_44);
    if (bVar2) {
      io::CodedOutputStream::WriteVarint32(output,tag);
      io::CodedOutputStream::WriteVarint32(output,local_44);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_40._M_string_length = 0;
      local_40.field_2._M_local_buf[0] = '\0';
      bVar2 = io::CodedInputStream::ReadString(input,&local_40,local_44);
      if (bVar2) {
        io::CodedOutputStream::WriteString(output,&local_40);
      }
      std::__cxx11::string::~string((string *)&local_40);
      return bVar2;
    }
    goto LAB_002d17f5;
  case 3:
    io::CodedOutputStream::WriteVarint32(output,tag);
    iVar1 = input->recursion_budget_;
    input->recursion_budget_ = iVar1 + -1;
    if ((0 < iVar1) && (bVar2 = SkipMessage(input,output), bVar2)) {
      if (input->recursion_budget_ < input->recursion_limit_) {
        input->recursion_budget_ = input->recursion_budget_ + 1;
      }
      return input->last_tag_ == (tag & 0xfffffff8 | 4);
    }
LAB_002d17f5:
    bVar2 = false;
    break;
  case 5:
    bVar2 = io::CodedInputStream::ReadLittleEndian32(input,(uint32_t *)&local_40);
    if (bVar2) {
      io::CodedOutputStream::WriteVarint32(output,tag);
      io::CodedOutputStream::WriteLittleEndian32(output,(uint32_t)local_40._M_dataplus._M_p);
    }
  }
  return bVar2;
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32_t tag,
                               io::CodedOutputStream* output) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64_t value;
      if (!input->ReadVarint64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64_t value;
      if (!input->ReadLittleEndian64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32_t length;
      if (!input->ReadVarint32(&length)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint32(length);
      // TODO(mkilavuz): Provide API to prevent extra string copying.
      std::string temp;
      if (!input->ReadString(&temp, length)) return false;
      output->WriteString(temp);
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      output->WriteVarint32(tag);
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, output)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32_t value;
      if (!input->ReadLittleEndian32(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian32(value);
      return true;
    }
    default: {
      return false;
    }
  }
}